

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserInputPtr xmlNewInputStream(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt_local;
  
  ctxt_local = (xmlParserCtxtPtr)(*xmlMalloc)(0x78);
  if (ctxt_local == (xmlParserCtxtPtr)0x0) {
    xmlCtxtErrMemory(ctxt);
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    memset(ctxt_local,0,0x78);
    ctxt_local->html = 1;
    *(undefined4 *)&ctxt_local->input = 1;
  }
  return (xmlParserInputPtr)ctxt_local;
}

Assistant:

xmlParserInputPtr
xmlNewInputStream(xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr input;

    input = (xmlParserInputPtr) xmlMalloc(sizeof(xmlParserInput));
    if (input == NULL) {
        xmlCtxtErrMemory(ctxt);
	return(NULL);
    }
    memset(input, 0, sizeof(xmlParserInput));
    input->line = 1;
    input->col = 1;

    return(input);
}